

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O0

SourceResultType __thiscall
duckdb::PhysicalOrder::GetData
          (PhysicalOrder *this,ExecutionContext *context,DataChunk *chunk,OperatorSourceInput *input
          )

{
  bool bVar1;
  PhysicalOrderGlobalSourceState *pPVar2;
  PhysicalOrderLocalSourceState *pPVar3;
  __int_type _Var4;
  OrderGlobalSinkState *args;
  idx_t iVar5;
  DataChunk *in_RDX;
  GlobalSortState *global_sort_state;
  OrderGlobalSinkState *sink;
  PhysicalOrderLocalSourceState *lstate;
  PhysicalOrderGlobalSourceState *gstate;
  DataChunk *in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  bool *in_stack_ffffffffffffffa8;
  bool local_1;
  
  pPVar2 = GlobalSourceState::Cast<duckdb::PhysicalOrderGlobalSourceState>
                     ((GlobalSourceState *)
                      CONCAT17(in_stack_ffffffffffffff97,
                               CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
  pPVar3 = LocalSourceState::Cast<duckdb::PhysicalOrderLocalSourceState>
                     ((LocalSourceState *)
                      CONCAT17(in_stack_ffffffffffffff97,
                               CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
                      *)0x184de95);
  if (bVar1) {
    unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
    operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                *)CONCAT17(in_stack_ffffffffffffff97,
                           CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
    iVar5 = PayloadScanner::Remaining((PayloadScanner *)0x184deb1);
    if (iVar5 == 0) {
      _Var4 = ::std::__atomic_base<unsigned_long>::operator++
                        (&(pPVar2->next_batch_index).super___atomic_base<unsigned_long>,0);
      pPVar3->batch_index = _Var4;
      unique_ptr<duckdb::PayloadScanner,std::default_delete<duckdb::PayloadScanner>,true>::
      unique_ptr<std::default_delete<duckdb::PayloadScanner>,void>
                ((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                  *)CONCAT17(in_stack_ffffffffffffff97,
                             CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                 in_stack_ffffffffffffff88);
      unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
      operator=((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                 *)CONCAT17(in_stack_ffffffffffffff97,
                            CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                (unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                 *)in_stack_ffffffffffffff88);
      unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
      ~unique_ptr((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                   *)0x184defe);
    }
  }
  if (pPVar3->batch_index < pPVar2->total_batches) {
    bVar1 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
                        *)0x184df2a);
    if (!bVar1) {
      unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
      operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                  *)CONCAT17(in_stack_ffffffffffffff97,
                             CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
      args = GlobalSinkState::Cast<duckdb::OrderGlobalSinkState>
                       ((GlobalSinkState *)
                        CONCAT17(in_stack_ffffffffffffff97,
                                 CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
      make_uniq<duckdb::PayloadScanner,duckdb::GlobalSortState&,unsigned_long&,bool>
                ((GlobalSortState *)args,(unsigned_long *)&args->global_sort_state,
                 in_stack_ffffffffffffffa8);
      unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
      operator=((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                 *)CONCAT17(in_stack_ffffffffffffff97,
                            CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
                (unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                 *)in_stack_ffffffffffffff88);
      unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
      ~unique_ptr((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                   *)0x184df96);
    }
    unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
    operator->((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                *)CONCAT17(in_stack_ffffffffffffff97,
                           CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)));
    PayloadScanner::Scan
              ((PayloadScanner *)
               CONCAT17(in_stack_ffffffffffffff97,
                        CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90)),
               in_stack_ffffffffffffff88);
    iVar5 = DataChunk::size(in_RDX);
    local_1 = iVar5 == 0;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

SourceResultType PhysicalOrder::GetData(ExecutionContext &context, DataChunk &chunk, OperatorSourceInput &input) const {
	auto &gstate = input.global_state.Cast<PhysicalOrderGlobalSourceState>();
	auto &lstate = input.local_state.Cast<PhysicalOrderLocalSourceState>();

	if (lstate.scanner && lstate.scanner->Remaining() == 0) {
		lstate.batch_index = gstate.next_batch_index++;
		lstate.scanner = nullptr;
	}

	if (lstate.batch_index >= gstate.total_batches) {
		return SourceResultType::FINISHED;
	}

	if (!lstate.scanner) {
		auto &sink = this->sink_state->Cast<OrderGlobalSinkState>();
		auto &global_sort_state = sink.global_sort_state;
		lstate.scanner = make_uniq<PayloadScanner>(global_sort_state, lstate.batch_index, true);
	}

	lstate.scanner->Scan(chunk);

	return chunk.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}